

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

char * fixed2float(FT_Int fixed,char *buf)

{
  char *pcVar1;
  int local_44;
  int local_40;
  FT_Int i;
  FT_Int frac_part;
  FT_Int int_part;
  char *pcStack_30;
  char tmp [5];
  char *q;
  char *p;
  char *buf_local;
  char *pcStack_10;
  FT_Int fixed_local;
  
  if (fixed == 0) {
    pcStack_10 = buf + 1;
    *buf = '0';
  }
  else {
    q = buf;
    buf_local._4_4_ = fixed;
    if (fixed < 0) {
      q = buf + 1;
      *buf = '-';
      buf_local._4_4_ = -fixed;
    }
    pcStack_30 = (char *)((long)&frac_part + 3);
    for (i = (int)buf_local._4_4_ >> 0x10 & 0xffff; 0 < i; i = i / 10) {
      pcVar1 = pcStack_30 + 1;
      *pcStack_30 = (char)(i % 10) + '0';
      pcStack_30 = pcVar1;
    }
    while (pcVar1 = q, (char *)((long)&frac_part + 3U) < pcStack_30) {
      *q = pcStack_30[-1];
      pcStack_30 = pcStack_30 + -1;
      q = q + 1;
    }
    if ((buf_local._4_4_ & 0xffff) == 0) {
      pcStack_10 = q;
    }
    else {
      *q = '.';
      local_40 = (buf_local._4_4_ & 0xffff) * 10 + 5;
      q = q + 1;
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        *q = (char)((long)local_40 / 0x10000) + '0';
        if (local_40 % 0x10000 == 0) {
          local_40 = 0;
          q = q + 1;
          break;
        }
        local_40 = (local_40 % 0x10000) * 10;
        q = q + 1;
      }
      q = q + -1;
      if ((long)q - (long)pcVar1 == 5) {
        if ((local_40 < 0x542e0) && (*q == 0x31)) {
          *q = 0x30;
        }
        else if ((local_40 == 0x2a120) && ((*q & 1U) != 0)) {
          *q = *q - 1;
        }
        else if ((local_40 < 0x2a120) && (*q != 0x30)) {
          *q = *q - 1;
        }
      }
      while (*q == '0') {
        *q = '\0';
        q = q + -1;
      }
      pcStack_10 = q + 1;
    }
  }
  return pcStack_10;
}

Assistant:

static char*
  fixed2float( FT_Int  fixed,
               char*   buf )
  {
    char*  p;
    char*  q;
    char   tmp[5];

    FT_Int  int_part;
    FT_Int  frac_part;

    FT_Int  i;


    p = buf;

    if ( fixed == 0 )
    {
      *p++ = '0';
      return p;
    }

    if ( fixed < 0 )
    {
      *p++ = '-';
      fixed = -fixed;
    }

    int_part  = ( fixed >> 16 ) & 0xFFFF;
    frac_part = fixed & 0xFFFF;

    /* get digits of integer part (in reverse order) */
    q = tmp;
    while ( int_part > 0 )
    {
      *q++      = '0' + int_part % 10;
      int_part /= 10;
    }

    /* copy digits in correct order to buffer */
    while ( q > tmp )
      *p++ = *--q;

    if ( !frac_part )
      return p;

    /* save position of point */
    q    = p;
    *p++ = '.';

    /* apply rounding */
    frac_part = frac_part * 10 + 5;

    /* get digits of fractional part */
    for ( i = 0; i < 5; i++ )
    {
      *p++ = '0' + (char)( frac_part / 0x10000L );

      frac_part %= 0x10000L;
      if ( !frac_part )
        break;

      frac_part *= 10;
    }

    /*
        If the remainder stored in `frac_part' (after the last FOR loop) is
        smaller than 34480*10, the resulting decimal value minus 0.00001 is
        an equivalent representation of `fixed'.

        The above FOR loop always finds the larger of the two values; I
        verified this by iterating over all possible fixed point numbers.

        If the remainder is 17232*10, both values are equally good, and we
        take the next even number (following IEEE 754's `round to nearest,
        ties to even' rounding rule).

        If the remainder is smaller than 17232*10, the lower of the two
        numbers is nearer to the exact result (values 17232 and 34480 were
        also found by testing all possible fixed point values).

        We use this to find a shorter decimal representation.  If not ending
        with digit zero, we take the representation with less error.
     */
    p--;
    if ( p - q == 5 )  /* five digits? */
    {
      /* take the representation that has zero as the last digit */
      if ( frac_part < 34480 * 10 &&
           *p == '1'              )
        *p = '0';

      /* otherwise use the one with less error */
      else if ( frac_part == 17232 * 10 &&
                *p & 1                  )
        *p -= 1;

      else if ( frac_part < 17232 * 10 &&
                *p != '0'              )
        *p -= 1;
    }

    /* remove trailing zeros */
    while ( *p == '0' )
      *p-- = '\0';

    return p + 1;
  }